

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib541.c
# Opt level: O3

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  long lVar4;
  char *pcVar5;
  stat file_info;
  stat64 sStack_b8;
  
  if (libtest_arg2 == (char *)0x0) {
    curl_mfprintf(_stderr,"Usage: <url> <file-to-upload>\n");
    return 0x76;
  }
  __stream = fopen64(libtest_arg2,"rb");
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    uVar1 = _stderr;
    iVar2 = *piVar3;
    pcVar5 = strerror(iVar2);
    curl_mfprintf(uVar1,"fopen failed with error: %d %s\n",iVar2,pcVar5);
    curl_mfprintf(_stderr,"Error opening file: %s\n",libtest_arg2);
    return -2;
  }
  iVar2 = fileno(__stream);
  iVar2 = fstat64(iVar2,&sStack_b8);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    uVar1 = _stderr;
    iVar2 = *piVar3;
    pcVar5 = strerror(iVar2);
    curl_mfprintf(uVar1,"fstat() failed with error: %d %s\n",iVar2,pcVar5);
    pcVar5 = "ERROR: cannot open file %s\n";
  }
  else {
    if (sStack_b8.st_size != 0) {
      iVar2 = curl_global_init(3);
      if (iVar2 == 0) {
        lVar4 = curl_easy_init();
        if (lVar4 != 0) {
          iVar2 = curl_easy_setopt(lVar4,0x2e,1);
          if ((((iVar2 == 0) && (iVar2 = curl_easy_setopt(lVar4,0x29,1), iVar2 == 0)) &&
              (iVar2 = curl_easy_setopt(lVar4,0x2712,URL), iVar2 == 0)) &&
             (iVar2 = curl_easy_setopt(lVar4,0x2719,__stream), iVar2 == 0)) {
            curl_easy_perform(lVar4);
            iVar2 = curl_easy_perform(lVar4);
          }
          fclose(__stream);
          curl_easy_cleanup(lVar4);
          curl_global_cleanup();
          return iVar2;
        }
        curl_mfprintf(_stderr,"curl_easy_init() failed\n");
        curl_global_cleanup();
      }
      else {
        curl_mfprintf(_stderr,"curl_global_init() failed\n");
      }
      goto LAB_0010137e;
    }
    pcVar5 = "ERROR: file %s has zero size!\n";
  }
  curl_mfprintf(_stderr,pcVar5,libtest_arg2);
LAB_0010137e:
  fclose(__stream);
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  FILE *hd_src;
  int hd;
  struct_stat file_info;
  int error;

  if(!libtest_arg2) {
    fprintf(stderr, "Usage: <url> <file-to-upload>\n");
    return TEST_ERR_USAGE;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    error = ERRNO;
    fprintf(stderr, "fopen failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "Error opening file: %s\n", libtest_arg2);
    return -2; /* if this happens things are major weird */
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    error = ERRNO;
    fprintf(stderr, "fstat() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "ERROR: cannot open file %s\n", libtest_arg2);
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  if(! file_info.st_size) {
    fprintf(stderr, "ERROR: file %s has zero size!\n", libtest_arg2);
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* get a curl handle */
  if((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* enable uploading */
  test_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* enable verbose */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* specify target */
  test_setopt(curl, CURLOPT_URL, URL);

  /* now specify which file to upload */
  test_setopt(curl, CURLOPT_READDATA, hd_src);

  /* Now run off and do what you've been told! */
  res = curl_easy_perform(curl);

  /* and now upload the exact same again, but without rewinding so it already
     is at end of file */
  res = curl_easy_perform(curl);

test_cleanup:

  /* close the local file */
  fclose(hd_src);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}